

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general.c
# Opt level: O0

axbStatus_t axbFinalize(axbHandle_s *handle)

{
  ulong local_28;
  size_t i_1;
  size_t i;
  axbHandle_s *handle_local;
  
  if (handle->init == 0x67932) {
    handle->init = handle->init + 1;
    for (i_1 = 0; i_1 < handle->opBackends_size; i_1 = i_1 + 1) {
      axbOpBackendDestroy(handle->opBackends[i_1]);
    }
    free(handle->opBackends);
    for (local_28 = 0; local_28 < handle->memBackends_size; local_28 = local_28 + 1) {
      axbMemBackendDestroy(handle->memBackends[local_28]);
    }
    free(handle->memBackends);
    free(handle);
    handle_local._4_4_ = 0;
  }
  else {
    handle_local._4_4_ = 0x67932;
  }
  return handle_local._4_4_;
}

Assistant:

axbStatus_t axbFinalize(struct axbHandle_s *handle)
{
  // guard against multiple free()
  if (handle->init != 424242) return 424242;
  handle->init += 1; // helper to track multiple free's on handle

  // free op backends
  // Note: op-backends may depend on mem-backends, so it's important to free the op-backends first.
  for (size_t i=0; i<handle->opBackends_size; ++i) {
    axbOpBackendDestroy(handle->opBackends[i]);
  }
  free(handle->opBackends);

  // free mem backends
  for (size_t i=0; i<handle->memBackends_size; ++i) {
    axbMemBackendDestroy(handle->memBackends[i]);
  }
  free(handle->memBackends);

  free(handle);
  return 0;
}